

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffgkns(fitsfile *fptr,char *keyname,int nstart,int nmax,char **value,int *nfound,int *status)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  __int32_t **pp_Var7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  int nkeys;
  int tstatus;
  int mkeys;
  char keyindex [8];
  char keyroot [75];
  char svalue [71];
  char comm [73];
  char card [81];
  int local_1c4;
  long local_1c0;
  int local_1b4;
  long local_1b0;
  int *local_1a8;
  long local_1a0;
  char **local_198;
  char *local_190;
  int local_184;
  char local_180 [8];
  char local_178 [80];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  iVar4 = *status;
  if (iVar4 < 1) {
    *nfound = 0;
    local_178[0] = '\0';
    local_198 = value;
    strncat(local_178,keyname,0x4a);
    sVar6 = strlen(local_178);
    uVar10 = (uint)sVar6;
    if (uVar10 != 0) {
      local_1a8 = nfound;
      if (0 < (int)uVar10) {
        pp_Var7 = __ctype_toupper_loc();
        uVar9 = 0;
        do {
          local_178[uVar9] = (char)(*pp_Var7)[local_178[uVar9]];
          uVar9 = uVar9 + 1;
        } while ((uVar10 & 0x7fffffff) != uVar9);
      }
      ffghps(fptr,&local_1c4,&local_184,status);
      if (2 < local_1c4) {
        local_190 = local_88 + (int)uVar10;
        local_1a0 = (long)(nstart + nmax + -1);
        local_1b0 = (long)nstart;
        bVar2 = true;
        iVar4 = 3;
        while( true ) {
          iVar5 = ffgrec(fptr,iVar4,local_88,status);
          if (0 < iVar5) break;
          iVar5 = strncmp(local_178,local_88,(long)(int)uVar10);
          if (iVar5 == 0) {
            local_180[0] = '\0';
            pcVar8 = strchr(local_88,0x3d);
            if (pcVar8 == (char *)0x0) goto LAB_001b2add;
            if (7 < (long)pcVar8 - (long)local_190) {
              *status = 0xcf;
              return 0xcf;
            }
            strncat(local_180,local_190,(long)pcVar8 - (long)local_190);
            local_1b4 = 0;
            iVar5 = ffc2ii(local_180,&local_1c0,&local_1b4);
            if ((0 < iVar5) || (local_1c0 < local_1b0 || local_1a0 < local_1c0)) goto LAB_001b2add;
            ffpsvc(local_88,local_128,local_d8,status);
            lVar3 = local_1b0;
            ffc2s(local_128,local_198[local_1c0 - local_1b0],status);
            if ((long)*local_1a8 <= local_1c0 - lVar3) {
              *local_1a8 = (int)(local_1c0 - lVar3) + 1;
            }
            if (*status != 0xcc) goto LAB_001b2add;
            *status = 0;
            bVar2 = false;
            bVar1 = local_1c4 <= iVar4;
            iVar4 = iVar4 + 1;
            if (bVar1) {
              iVar4 = *status;
LAB_001b2c24:
              if (0 < iVar4) {
                return iVar4;
              }
              *status = 0xcc;
              return 0xcc;
            }
          }
          else {
LAB_001b2add:
            bVar1 = local_1c4 <= iVar4;
            iVar4 = iVar4 + 1;
            if (bVar1) {
              iVar4 = *status;
              if (bVar2) {
                return iVar4;
              }
              goto LAB_001b2c24;
            }
          }
        }
      }
    }
    iVar4 = *status;
  }
  return iVar4;
}

Assistant:

int ffgkns( fitsfile *fptr,     /* I - FITS file pointer                    */
            const char *keyname,      /* I - root name of keywords to read        */
            int  nstart,        /* I - starting index number                */
            int  nmax,          /* I - maximum number of keywords to return */
            char *value[],      /* O - array of pointers to keyword values  */
            int  *nfound,       /* O - number of values that were returned  */
            int  *status)       /* IO - error status                        */
/*
  Read (get) an indexed array of keywords with index numbers between
  NSTART and (NSTART + NMAX -1) inclusive.  
  This routine does NOT support the HEASARC long string convention.
*/
{
    int nend, lenroot, ii, nkeys, mkeys, tstatus, undefinedval;
    long ival;
    char keyroot[FLEN_KEYWORD], keyindex[8], card[FLEN_CARD];
    char svalue[FLEN_VALUE], comm[FLEN_COMMENT], *equalssign;

    if (*status > 0)
        return(*status);

    *nfound = 0;
    nend = nstart + nmax - 1;

    keyroot[0] = '\0';
    strncat(keyroot, keyname, FLEN_KEYWORD - 1);
     
    lenroot = strlen(keyroot);
    
    if (lenroot == 0)     /*  root must be at least 1 char long  */
        return(*status);

    for (ii=0; ii < lenroot; ii++)           /*  make sure upper case  */
        keyroot[ii] = toupper(keyroot[ii]);

    ffghps(fptr, &nkeys, &mkeys, status);  /*  get the number of keywords  */

    undefinedval = FALSE;
    for (ii=3; ii <= nkeys; ii++)  
    {
       if (ffgrec(fptr, ii, card, status) > 0)     /*  get next keyword  */
           return(*status);

       if (strncmp(keyroot, card, lenroot) == 0)  /* see if keyword matches */
       {
          keyindex[0] = '\0';
          equalssign = strchr(card, '=');
	  if (equalssign == 0) continue;  /* keyword has no value */

          if (equalssign - card - lenroot > 7)
          {
             return (*status=BAD_KEYCHAR);
          }
          strncat(keyindex, &card[lenroot], equalssign - card  - lenroot);  /*  copy suffix  */
          tstatus = 0;
          if (ffc2ii(keyindex, &ival, &tstatus) <= 0)     /*  test suffix  */
          {
             if (ival <= nend && ival >= nstart)
             {
                ffpsvc(card, svalue, comm, status);  /*  parse the value */
                ffc2s(svalue, value[ival-nstart], status); /* convert */
                if (ival - nstart + 1 > *nfound)
                      *nfound = ival - nstart + 1;  /*  max found */ 

                if (*status == VALUE_UNDEFINED)
                {
                   undefinedval = TRUE;
                   *status = 0;  /* reset status to read remaining values */
                }
             }
          }
       }
    }
    if (undefinedval && (*status <= 0) )
        *status = VALUE_UNDEFINED;  /* report at least 1 value undefined */

    return(*status);
}